

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::RNEMD::setAngularMomentumFluxVector
          (RNEMD *this,vector<double,_std::allocator<double>_> *angularMomentumFluxVector)

{
  pointer pdVar1;
  long lVar2;
  
  pdVar1 = (angularMomentumFluxVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(angularMomentumFluxVector->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar2 != 0x18) {
    snprintf(painCave.errMsg,2000,
             "RNEMD: Incorrect number of parameters specified for angularMomentumFluxVector.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,lVar2 >> 3);
    painCave.isFatal = 1;
    simError();
    pdVar1 = (angularMomentumFluxVector->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
  }
  (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[0] = *pdVar1;
  (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[1] = pdVar1[1];
  (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[2] = pdVar1[2];
  return;
}

Assistant:

void RNEMD::setAngularMomentumFluxVector(
      const std::vector<RealType>& angularMomentumFluxVector) {
    if (angularMomentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "angularMomentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               angularMomentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    angularMomentumFluxVector_.x() = angularMomentumFluxVector[0];
    angularMomentumFluxVector_.y() = angularMomentumFluxVector[1];
    angularMomentumFluxVector_.z() = angularMomentumFluxVector[2];
  }